

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

void __thiscall cfd::TransactionContext::Verify(TransactionContext *this,OutPoint *outpoint)

{
  long lVar1;
  long lVar2;
  pointer pOVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  CfdException *pCVar8;
  long lVar9;
  OutPoint *target;
  pointer pOVar10;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxo_list;
  OutPoint target_outpoint;
  UtxoData work_utxo;
  UtxoData utxo;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_aa8;
  Script local_a90;
  function<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  local_a58;
  OutPoint local_a38;
  UtxoData local_a10;
  UtxoData local_520;
  
  UtxoData::UtxoData(&local_520);
  bVar4 = IsFindUtxoMap(this,outpoint,&local_520);
  if (!bVar4) {
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a10.block_height = (uint64_t)&local_a10.block_hash.data_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a10,"Utxo is not found. verify fail.","");
    core::CfdException::CfdException(pCVar8,kCfdIllegalStateError,(string *)&local_a10);
    __cxa_throw(pCVar8,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  uVar6 = (**(code **)(*(long *)this + 0x78))(this,outpoint);
  lVar1 = *(long *)&this->field_0x10;
  local_aa8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_aa8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_aa8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetLockingScriptFromUtxoData((Script *)&local_a10,&local_520);
  cfd::core::Script::operator=(&local_520.locking_script,(Script *)&local_a10);
  core::Script::~Script((Script *)&local_a10);
  cVar5 = cfd::core::Script::IsTaprootScript();
  if (cVar5 != '\0') {
    UtxoData::UtxoData(&local_a10);
    lVar9 = *(long *)&this->field_0x10;
    lVar2 = *(long *)&this->field_0x18;
    if (lVar9 != lVar2) {
      do {
        cfd::core::AbstractTxIn::GetTxid();
        uVar7 = cfd::core::AbstractTxIn::GetVout();
        cfd::core::OutPoint::OutPoint(&local_a38,(Txid *)&local_a90,uVar7);
        local_a90._vptr_Script = (_func_int **)&PTR__Txid_002b0f00;
        if (local_a90.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a90.script_data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        bVar4 = IsFindUtxoMap(this,&local_a38,&local_a10);
        if (!bVar4) {
          pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
          local_a90._vptr_Script =
               (_func_int **)
               ((long)&local_a90.script_data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a90,"Utxo is not found. Verify fail.","");
          core::CfdException::CfdException(pCVar8,kCfdIllegalStateError,(string *)&local_a90);
          __cxa_throw(pCVar8,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
        GetLockingScriptFromUtxoData(&local_a90,&local_a10);
        cfd::core::Script::operator=(&local_a10.locking_script,&local_a90);
        core::Script::~Script(&local_a90);
        std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>::emplace_back<cfd::UtxoData&>
                  ((vector<cfd::UtxoData,std::allocator<cfd::UtxoData>> *)&local_aa8,&local_a10);
        local_a38.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002b0f00;
        if (local_a38.txid_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a38.txid_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        lVar9 = lVar9 + 0x90;
      } while (lVar9 != lVar2);
    }
    UtxoData::~UtxoData(&local_a10);
  }
  local_a58.super__Function_base._M_functor._8_8_ = 0;
  local_a58.super__Function_base._M_functor._M_unused._M_object = CreateTxSighash;
  local_a58._M_invoker =
       std::
       _Function_handler<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*),_cfd::core::ByteData256_(*)(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
       ::_M_invoke;
  local_a58.super__Function_base._M_manager =
       std::
       _Function_handler<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*),_cfd::core::ByteData256_(*)(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
       ::_M_manager;
  TransactionContextUtil::Verify<cfd::TransactionContext>
            (this,outpoint,&local_520,(AbstractTxIn *)((ulong)uVar6 * 0x90 + lVar1),&local_a58);
  if (local_a58.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a58.super__Function_base._M_manager)
              ((_Any_data *)&local_a58,(_Any_data *)&local_a58,__destroy_functor);
  }
  pOVar3 = (this->verify_map_).
           super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pOVar10 = (this->verify_map_).
                 super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>.
                 _M_impl.super__Vector_impl_data._M_start; pOVar10 != pOVar3; pOVar10 = pOVar10 + 1)
  {
    cVar5 = cfd::core::OutPoint::operator==(outpoint,pOVar10);
    if (cVar5 != '\0') goto LAB_001d230a;
  }
  std::vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>>::
  emplace_back<cfd::core::OutPoint_const&>
            ((vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>> *)&this->verify_map_,
             outpoint);
LAB_001d230a:
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_aa8);
  UtxoData::~UtxoData(&local_520);
  return;
}

Assistant:

void TransactionContext::Verify(const OutPoint& outpoint) {
  UtxoData utxo;
  if (!IsFindUtxoMap(outpoint, &utxo)) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Utxo is not found. verify fail.");
  }
  const auto& txin = vin_[GetTxInIndex(outpoint)];

  std::vector<UtxoData> utxo_list;
  utxo.locking_script = GetLockingScriptFromUtxoData(utxo);
  if (utxo.locking_script.IsTaprootScript()) {
    UtxoData work_utxo;
    for (const auto& txin_ref : vin_) {
      OutPoint target_outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
      if (!IsFindUtxoMap(target_outpoint, &work_utxo)) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Utxo is not found. Verify fail.");
      }
      work_utxo.locking_script = GetLockingScriptFromUtxoData(work_utxo);
      utxo_list.emplace_back(work_utxo);
    }
  }
  TransactionContextUtil::Verify<TransactionContext>(
      this, outpoint, utxo, &txin, CreateTxSighash);
  if (!IsFindOutPoint(verify_map_, outpoint)) {
    verify_map_.emplace_back(outpoint);
  }
}